

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

void redraw_overlays(void)

{
  Fl_Window_Type *this;
  int iVar1;
  Fl_Type **ppFVar2;
  
  ppFVar2 = &Fl_Type::first;
  while (this = (Fl_Window_Type *)*ppFVar2, this != (Fl_Window_Type *)0x0) {
    iVar1 = (*(this->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x21])(this);
    if (iVar1 != 0) {
      Fl_Window_Type::fix_overlay(this);
    }
    ppFVar2 = &(this->super_Fl_Widget_Type).super_Fl_Type.next;
  }
  return;
}

Assistant:

void redraw_overlays() {
  for (Fl_Type *o=Fl_Type::first; o; o=o->next)
    if (o->is_window()) ((Fl_Window_Type*)o)->fix_overlay();
}